

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::SigmoidParameter::InternalSerializeWithCachedSizesToArray
          (SigmoidParameter *this,bool deterministic,uint8 *target)

{
  SigmoidParameter_Engine value;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  SigmoidParameter *this_local;
  
  puStack_40 = target;
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    value = engine(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,value,target);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SigmoidParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* SigmoidParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.SigmoidParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.SigmoidParameter.Engine engine = 1 [default = DEFAULT];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->engine(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.SigmoidParameter)
  return target;
}